

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_data.hpp
# Opt level: O2

void __thiscall
boost::detail::thread_data_base::notify_all_at_thread_exit
          (thread_data_base *this,condition_variable *cv,mutex *m)

{
  pair<boost::condition_variable_*,_boost::mutex_*> local_10;
  
  local_10.first = cv;
  local_10.second = m;
  std::
  vector<std::pair<boost::condition_variable*,boost::mutex*>,std::allocator<std::pair<boost::condition_variable*,boost::mutex*>>>
  ::emplace_back<std::pair<boost::condition_variable*,boost::mutex*>>
            ((vector<std::pair<boost::condition_variable*,boost::mutex*>,std::allocator<std::pair<boost::condition_variable*,boost::mutex*>>>
              *)&this->notify,&local_10);
  return;
}

Assistant:

virtual void notify_all_at_thread_exit(condition_variable* cv, mutex* m)
            {
              notify.push_back(std::pair<condition_variable*, mutex*>(cv, m));
            }